

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O2

void __thiscall
PlanningUnitMADPDiscrete::JointAOHIndexToIndividualActionObservationVectors
          (PlanningUnitMADPDiscrete *this,LIndex jaohI,
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          *indivO_vec,
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          *indivA_vec)

{
  _func_int *p_Var1;
  Index IVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Index *jaIs;
  ulong uVar4;
  Index *joIs;
  Index agentI;
  pointer puVar5;
  Index aIStack_90 [2];
  Index *local_88;
  Index *local_80;
  undefined1 local_78 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> indivA_IndicesThisT;
  value_type_conflict1 local_54;
  undefined1 local_50 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> indivO_IndicesThisT;
  
  aIStack_90[0] = 0x4652c6;
  aIStack_90[1] = 0;
  IVar2 = GetTimeStepForJAOHI(this,jaohI);
  puVar5 = (pointer)(ulong)IVar2;
  uVar4 = (long)puVar5 * 4 + 0xfU & 0xfffffffffffffff0;
  joIs = (Index *)((long)&local_88 - uVar4);
  jaIs = (Index *)((long)joIs - uVar4);
  local_88 = joIs;
  local_80 = jaIs;
  jaIs[-2] = 0x4652fc;
  jaIs[-1] = 0;
  GetJointActionObservationHistoryArrays(this,jaohI,IVar2,jaIs,joIs);
  p_Var1 = (this->super_PlanningUnit)._vptr_PlanningUnit[6];
  jaIs[-2] = 0x465305;
  jaIs[-1] = 0;
  iVar3 = (*p_Var1)(this);
  local_54 = 0;
  indivA_IndicesThisT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = puVar5;
  jaIs[-2] = 0x465323;
  jaIs[-1] = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,(size_type)puVar5,
             &local_54,
             (allocator_type *)
             ((long)&indivO_IndicesThisT.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 6));
  jaIs[-2] = 0x465337;
  jaIs[-1] = 0;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)local_78,CONCAT44(extraout_var,iVar3),(value_type *)local_50,
           (allocator_type *)
           ((long)&indivO_IndicesThisT.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7));
  jaIs[-2] = 0x465346;
  jaIs[-1] = 0;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::_M_move_assign(indivO_vec,
                   (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    *)local_78);
  jaIs[-2] = 0x46534e;
  jaIs[-1] = 0;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)local_78);
  jaIs[-2] = 0x465357;
  jaIs[-1] = 0;
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
  puVar5 = indivA_IndicesThisT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_54 = 0;
  jaIs[-2] = 0x46536f;
  jaIs[-1] = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,(size_type)puVar5,
             &local_54,
             (allocator_type *)
             ((long)&indivO_IndicesThisT.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 6));
  jaIs[-2] = 0x465383;
  jaIs[-1] = 0;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)local_78,CONCAT44(extraout_var,iVar3),(value_type *)local_50,
           (allocator_type *)
           ((long)&indivO_IndicesThisT.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7));
  jaIs[-2] = 0x465392;
  jaIs[-1] = 0;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::_M_move_assign(indivA_vec,
                   (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    *)local_78);
  jaIs[-2] = 0x46539a;
  jaIs[-1] = 0;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)local_78);
  jaIs[-2] = 0x4653a3;
  jaIs[-1] = 0;
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
  for (puVar5 = (pointer)0x0;
      puVar5 != indivA_IndicesThisT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
      puVar5 = (pointer)((long)puVar5 + 1)) {
    IVar2 = local_80[(long)puVar5];
    jaIs[-2] = 0x4653c3;
    jaIs[-1] = 0;
    JointToIndividualActionIndices
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78,this,IVar2);
    IVar2 = local_88[(long)puVar5];
    jaIs[-2] = 0x4653d7;
    jaIs[-1] = 0;
    JointToIndividualObservationIndices
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,this,IVar2);
    uVar4 = 0;
    while( true ) {
      p_Var1 = (this->super_PlanningUnit)._vptr_PlanningUnit[6];
      jaIs[-2] = 0x4653e3;
      jaIs[-1] = 0;
      iVar3 = (*p_Var1)(this);
      if (CONCAT44(extraout_var_00,iVar3) <= uVar4) break;
      *(uint *)(*(long *)&(indivO_vec->
                          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start[uVar4].
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data + (long)puVar5 * 4) =
           *(pointer)((long)local_50 + uVar4 * 4);
      *(undefined4 *)
       (*(long *)&(indivA_vec->
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start[uVar4].
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data + (long)puVar5 * 4) =
           *(undefined4 *)
            ((long)&(((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_78)->
                    _M_impl).super__Vector_impl_data._M_start + uVar4 * 4);
      uVar4 = (ulong)((int)uVar4 + 1);
    }
    jaIs[-2] = 0x465422;
    jaIs[-1] = 0;
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
    jaIs[-2] = 0x46542e;
    jaIs[-1] = 0;
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_78);
  }
  return;
}

Assistant:

void
PlanningUnitMADPDiscrete::JointAOHIndexToIndividualActionObservationVectors(
        LIndex jaohI,
        vector< vector<Index> >& indivO_vec,
        vector< vector<Index> >& indivA_vec
        ) const
{
    Index t = GetTimeStepForJAOHI(jaohI);
    Index jo_array[t];
    Index ja_array[t];

    GetJointActionObservationHistoryArrays(jaohI, t, ja_array, jo_array);      

    size_t nrAgents = GetNrAgents();
    //convert joint observations -> indiv. observations
    //indivO_vec[agentI][t] = oI
    indivO_vec = vector< vector<Index> >(nrAgents, vector<Index>(t, 0));
    indivA_vec = vector< vector<Index> >(nrAgents, vector<Index>(t, 0));
    for (Index ts=0; ts<t; ts++)
    {
        vector<Index> indivA_IndicesThisT = 
            JointToIndividualActionIndices(ja_array[ts]);
        vector<Index> indivO_IndicesThisT = 
            JointToIndividualObservationIndices(jo_array[ts]);
        for (Index agentI=0; agentI<GetNrAgents(); agentI++)
        {
            indivO_vec[agentI][ts] = indivO_IndicesThisT[agentI];
            indivA_vec[agentI][ts] = indivA_IndicesThisT[agentI];
        }
    }
}